

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O3

bool CLI::detail::valid_later_char<char>(char c)

{
  ctype *pcVar1;
  byte bVar2;
  locale alStack_18 [8];
  
  ::std::locale::locale(alStack_18);
  pcVar1 = ::std::use_facet<std::ctype<char>>(alStack_18);
  bVar2 = 1;
  if ((*(byte *)(*(long *)(pcVar1 + 0x30) + 1 + (ulong)(byte)c * 2) & 0xc) == 0) {
    if ((byte)(c - 0x2dU) < 0x33) {
      bVar2 = (byte)(0x4000000000003 >> (c - 0x2dU & 0x3f));
    }
    else {
      bVar2 = 0;
    }
  }
  ::std::locale::~locale(alStack_18);
  return (bool)(bVar2 & 1);
}

Assistant:

bool valid_later_char(T c) {
    return std::isalnum(c, std::locale()) || c == '_' || c == '.' || c == '-';
}